

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::TriageCompareLineSin2Distance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a0,Vector3<long_double> *a1,
              longdouble r2,Vector3<long_double> *n,longdouble n1,longdouble n2)

{
  int iVar1;
  long lVar2;
  Vector3<long_double> *pVVar3;
  bool bVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  
  iVar1 = -1;
  if (r2 < (longdouble)2.0) {
    lVar5 = ((longdouble)1 + r2 * (longdouble)-0.25) * r2 * n2;
    lVar6 = *(longdouble *)x->c_;
    lVar9 = *(longdouble *)a0->c_ - lVar6;
    lVar7 = *(longdouble *)(x->c_ + 1);
    lVar10 = *(longdouble *)(a0->c_ + 1) - lVar7;
    lVar8 = *(longdouble *)(x->c_ + 2);
    lVar11 = *(longdouble *)(a0->c_ + 2) - lVar8;
    lVar12 = lVar11 * lVar11 + lVar10 * lVar10 + lVar9 * lVar9;
    lVar9 = *(longdouble *)a1->c_ - lVar6;
    lVar10 = *(longdouble *)(a1->c_ + 1) - lVar7;
    lVar11 = *(longdouble *)(a1->c_ + 2) - lVar8;
    lVar9 = lVar11 * lVar11 + lVar10 * lVar10 + lVar9 * lVar9;
    pVVar3 = a0;
    if (lVar9 <= lVar12) {
      pVVar3 = a1;
      if ((lVar12 == lVar9) && (pVVar3 = a1, !NAN(lVar12) && !NAN(lVar9))) {
        lVar2 = 0;
        do {
          lVar9 = *(longdouble *)((long)a0->c_ + lVar2);
          lVar10 = *(longdouble *)((long)a1->c_ + lVar2);
          pVVar3 = a0;
          if ((lVar9 < lVar10) || (pVVar3 = a1, lVar10 < lVar9)) break;
          bVar4 = lVar2 != 0x20;
          lVar2 = lVar2 + 0x10;
          pVVar3 = a1;
        } while (bVar4);
      }
    }
    lVar7 = *(longdouble *)(n->c_ + 1) * (lVar7 - *(longdouble *)(pVVar3->c_ + 1)) +
            (longdouble)0 + *(longdouble *)n->c_ * (lVar6 - *(longdouble *)pVVar3->c_) +
            *(longdouble *)(n->c_ + 2) * (lVar8 - *(longdouble *)(pVVar3->c_ + 2));
    sqrtl();
    in_ST0 = (n1 * (longdouble)6.964101615137754 + (longdouble)6.153480596427404e-15) *
             (longdouble)5.421011e-20 * in_ST0;
    lVar6 = lVar5 * (*(longdouble *)(x->c_ + 2) * *(longdouble *)(x->c_ + 2) +
                    *(longdouble *)(x->c_ + 1) * *(longdouble *)(x->c_ + 1) +
                    *(longdouble *)x->c_ * *(longdouble *)x->c_);
    lVar8 = lVar7 * lVar7 * (longdouble)2.1684043e-19 + (ABS(lVar7) + ABS(lVar7) + in_ST0) * in_ST0
            + lVar5 * (longdouble)3.2526065e-19 + (longdouble)2.1684043e-19 * lVar6;
    lVar6 = lVar7 * lVar7 - lVar6;
    iVar1 = 1;
    if (lVar6 <= lVar8) {
      iVar1 = -(uint)(lVar6 < -lVar8);
    }
  }
  return iVar1;
}

Assistant:

int TriageCompareLineSin2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute sin^2(distance to edge) to get the best accuracy
  // when the distance limit is small (e.g., S2::kIntersectionError).
  T n2sin2_r = n2 * r2 * (1 - 0.25 * r2);
  T n2sin2_r_error = 6 * T_ERR * n2sin2_r;
  T ax2, xDn = (x - GetClosestVertex(x, a0, a1, &ax2)).DotProd(n);
  T xDn2 = xDn * xDn;
  const T c1 = (((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) *
                T_ERR * sqrt(ax2));
  T xDn2_error = 4 * T_ERR * xDn2 + (2 * fabs(xDn) + c1) * c1;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to with a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2sin2_r *= x.Norm2();
    n2sin2_r_error += 4 * T_ERR * n2sin2_r;
  } else {
    n2sin2_r_error += 8 * DBL_ERR * n2sin2_r;
  }
  T diff = xDn2 - n2sin2_r;
  T error = xDn2_error + n2sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}